

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O1

void binbuf_restore(_binbuf *x,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  char *__s1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  word wVar9;
  long lVar10;
  char cVar11;
  t_atom *ptVar12;
  int dollar;
  char buf [1000];
  t_float local_41c;
  char local_418 [1000];
  
  iVar6 = x->b_n;
  iVar5 = binbuf_resize(x,iVar6 + argc);
  if (iVar5 == 0) {
    pd_error((void *)0x0,"binbuf_restore: out of space");
    return;
  }
  if (argc != 0) {
    ptVar12 = x->b_vec + iVar6;
    do {
      if (argv->a_type == A_SYMBOL) {
        ptVar1 = (argv->a_w).w_symbol;
        __s1 = ptVar1->s_name;
        iVar6 = strcmp(__s1,";");
        if (iVar6 == 0) {
          ptVar12->a_type = A_SEMI;
        }
        else {
          iVar6 = strcmp(__s1,",");
          if (iVar6 != 0) {
            pcVar7 = strchr(__s1,0x5c);
            if (pcVar7 == (char *)0x0) {
              bVar3 = true;
              pcVar7 = __s1;
            }
            else {
              pcVar7 = ptVar1->s_name;
              cVar11 = *pcVar7;
              pcVar8 = local_418;
              if (cVar11 == '\0') {
                bVar3 = true;
              }
              else {
                bVar2 = false;
                bVar3 = false;
                lVar10 = 0;
                do {
                  pcVar7 = pcVar7 + 1;
                  if (bVar2) {
LAB_001694b4:
                    lVar10 = lVar10 + 1;
                    *pcVar8 = cVar11;
                    bVar2 = false;
                  }
                  else {
                    if (cVar11 != '\\') {
                      if ((cVar11 == '$') && ((byte)(*pcVar7 - 0x30U) < 10)) {
                        bVar3 = true;
                      }
                      goto LAB_001694b4;
                    }
                    bVar2 = true;
                  }
                  pcVar8 = local_418 + lVar10;
                  cVar11 = *pcVar7;
                } while ((cVar11 != '\0') && (lVar10 < 999));
                bVar3 = !bVar3;
              }
              *pcVar8 = '\0';
              pcVar7 = local_418;
            }
            if (bVar3) {
              if (pcVar7 == __s1) {
                pcVar8 = strchr(pcVar7,0x24);
                if ((pcVar8 != (char *)0x0) && ((byte)(pcVar8[1] - 0x30U) < 10)) goto LAB_00169557;
                ptVar12->a_type = A_SYMBOL;
                goto LAB_001695c5;
              }
              ptVar12->a_type = A_SYMBOL;
LAB_0016957f:
              wVar9.w_symbol = gensym(pcVar7);
            }
            else {
LAB_00169557:
              pcVar8 = pcVar7;
              if (*pcVar7 == '$') {
                do {
                  cVar11 = pcVar8[1];
                  if (cVar11 == '\0') {
                    local_41c = 0.0;
                    __isoc99_sscanf(pcVar7 + 1,"%d",&local_41c);
                    ptVar12->a_type = A_DOLLAR;
                    (ptVar12->a_w).w_float = local_41c;
                    goto LAB_001695ce;
                  }
                  pcVar8 = pcVar8 + 1;
                } while (0xf5 < (byte)(cVar11 - 0x3aU));
              }
              ptVar12->a_type = A_DOLLSYM;
              if (pcVar7 != __s1) goto LAB_0016957f;
LAB_001695c5:
              wVar9 = argv->a_w;
            }
            (ptVar12->a_w).w_symbol = (t_symbol *)wVar9;
            goto LAB_001695ce;
          }
          ptVar12->a_type = A_COMMA;
        }
        (ptVar12->a_w).w_float = 0.0;
      }
      else {
        uVar4 = *(undefined4 *)&argv->field_0x4;
        wVar9 = argv->a_w;
        ptVar12->a_type = argv->a_type;
        *(undefined4 *)&ptVar12->field_0x4 = uVar4;
        ptVar12->a_w = wVar9;
      }
LAB_001695ce:
      argc = argc + -1;
      argv = argv + 1;
      ptVar12 = ptVar12 + 1;
    } while (argc != 0);
  }
  return;
}

Assistant:

void binbuf_restore(t_binbuf *x, int argc, const t_atom *argv)
{
    int previoussize = x->b_n;
    int newsize = previoussize + argc, i;
    t_atom *ap;

    if (!binbuf_resize(x, newsize))
    {
        pd_error(0, "binbuf_restore: out of space");
        return;
    }

    for (ap = x->b_vec + previoussize, i = argc; i--; ap++)
    {
        if (argv->a_type == A_SYMBOL)
        {
            const char *str = argv->a_w.w_symbol->s_name, *str2;
            if (!strcmp(str, ";")) SETSEMI(ap);
            else if (!strcmp(str, ",")) SETCOMMA(ap);
            else
            {
                char buf[MAXPDSTRING], *sp1;
                const char *sp2, *usestr;
                int dollar = 0;
                if (strchr(str, '\\'))
                {
                    int slashed = 0;
                    for (sp1 = buf, sp2 = argv->a_w.w_symbol->s_name;
                        *sp2 && sp1 < buf + (MAXPDSTRING-1);
                            sp2++)
                    {
                        if (slashed)
                            *sp1++ = *sp2, slashed = 0;
                        else if (*sp2 == '\\')
                            slashed = 1;
                        else
                        {
                            if (*sp2 == '$' && sp2[1] >= '0' && sp2[1] <= '9')
                                dollar = 1;
                            *sp1++ = *sp2;
                            slashed = 0;
                        }
                    }
                    *sp1 = 0;
                    usestr = buf;
                }
                else usestr = str;
                if (dollar || (usestr== str && (str2 = strchr(usestr, '$')) &&
                    str2[1] >= '0' && str2[1] <= '9'))
                {
                    int dollsym = 0;
                    if (*usestr != '$')
                        dollsym = 1;
                    else for (str2 = usestr + 1; *str2; str2++)
                        if (*str2 < '0' || *str2 > '9')
                    {
                        dollsym = 1;
                        break;
                    }
                    if (dollsym)
                        SETDOLLSYM(ap, usestr == str ?
                            argv->a_w.w_symbol : gensym(usestr));
                    else
                    {
                        int dollar = 0;
                        sscanf(usestr + 1, "%d", &dollar);
                        SETDOLLAR(ap, dollar);
                    }
                }
                else SETSYMBOL(ap, usestr == str ?
                    argv->a_w.w_symbol : gensym(usestr));
                /* fprintf(stderr, "arg %s -> binbuf %s type %d\n",
                    argv->a_w.w_symbol->s_name, usestr, ap->a_type); */
            }
            argv++;
        }
        else *ap = *(argv++);
    }
}